

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool ON_ReparameterizeRationalNurbsCurve
               (double c,int dim,int order,int cv_count,int cvstride,double *cv,double *knot)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_78;
  int local_74;
  int j;
  int i;
  double w1;
  double w0;
  double d;
  double k;
  double k1;
  double k0;
  double c1;
  double *knot_local;
  double *cv_local;
  int cvstride_local;
  int cv_count_local;
  int order_local;
  int dim_local;
  double c_local;
  
  dVar5 = c - 1.0;
  bVar3 = ON_IsValid(c);
  if (((bVar3) && (bVar3 = ON_IsValid(dVar5), bVar3)) && ((c != 0.0 || (NAN(c))))) {
    if ((c != 1.0) || (NAN(c))) {
      dVar1 = knot[order + -2];
      dVar2 = knot[cv_count + -1];
      dVar6 = dVar2 - dVar1;
      bVar3 = ON_IsValid(dVar6);
      if ((!bVar3) || (dVar6 <= 0.0)) {
        c_local._7_1_ = false;
      }
      else {
        for (local_74 = 0; local_74 < cv_count + order + -2; local_74 = local_74 + 1) {
          dVar7 = (knot[local_74] - dVar1) * (1.0 / dVar6);
          knot[local_74] = (c * dVar7) / (dVar5 * dVar7 + 1.0);
        }
        c1 = (double)knot;
        knot_local = cv;
        for (local_74 = 0; local_74 < cv_count; local_74 = local_74 + 1) {
          w0 = -dVar5 * *(double *)c1 + c;
          local_78 = order + -2;
          while (local_78 != 0) {
            w0 = (-dVar5 * *(double *)((long)c1 + 8 + (long)(local_78 + -1) * 8) + c) * w0;
            local_78 = local_78 + -1;
          }
          dVar6 = knot_local[dim];
          local_78 = dim;
          while (local_78 != 0) {
            *knot_local = w0 * *knot_local;
            local_78 = local_78 + -1;
            knot_local = knot_local + 1;
          }
          *knot_local = dVar6 * w0;
          knot_local = knot_local + (long)(cvstride - (dim + 1)) + 1;
          c1 = (double)((long)c1 + 8);
        }
        lVar4 = (long)c1 + (long)cv_count * -8;
        for (local_74 = 0; local_74 < cv_count + order + -2; local_74 = local_74 + 1) {
          dVar5 = *(double *)(lVar4 + (long)local_74 * 8);
          *(double *)(lVar4 + (long)local_74 * 8) = (1.0 - dVar5) * dVar1 + dVar5 * dVar2;
        }
        c_local._7_1_ = true;
      }
    }
    else {
      c_local._7_1_ = true;
    }
  }
  else {
    c_local._7_1_ = false;
  }
  return c_local._7_1_;
}

Assistant:

bool ON_ReparameterizeRationalNurbsCurve(
          double c, 
          int dim, 
          int order, 
          int cv_count,
          int cvstride,
          double* cv,
          double* knot
          )
{
  // Reference
  //  E. T. Y. Lee and M. L. Lucian 
  //  Mobius reparameterization of rational B-splines
  //  CAGD Vol8 pp 213-215 1991
  const double c1 = c-1.0;
  double k0, k1, k, d, w0, w1;
  int i,j;

  if ( !ON_IsValid(c) || !ON_IsValid(c1) || 0.0 == c )
    return false;

  if ( 1.0 == c )
    return true;

  // change domain to [0,1] and then adjust knots
  k0 = knot[order-2];
  k1 = knot[cv_count-1];
  d = k1 - k0;
  if ( !ON_IsValid(d) || d <= 0.0 )
    return false;
  d = 1.0/d;
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    k = (k - k0)*d;
    knot[i] = c*k/(c1*k+1.0);
  }

  // adjust cvs
  order -= 2;
  cvstride -= (dim+1);
  for ( i = 0; i < cv_count; i++ )
  {
    d = c - c1*(*knot++);
    j = order;
    while(j--)
    {
      d *= c - c1*knot[j];
    }
    w0 = cv[dim];
    w1 = w0*d;
    j = dim;
    while(j--)
      *cv++ *= d;
    *cv++ = w1;
    cv += cvstride;
  }
  order += 2;
  cvstride += (dim+1);
  cv -= cv_count*cvstride;
  knot -= cv_count;

  // change domain back to [k0,k1]
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    knot[i] = (1.0-k)*k0 + k*k1;
  }

  return true;
}